

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

error_code_t *
base64::detail::invalid_buffer_size_error<base64::url_encoding_t>
          (error_code_t *__return_storage_ptr__,size_t base64_buffer_size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  string msg;
  allocator<char> local_59;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_38,0x100,'\0');
  snprintf(local_38._M_dataplus._M_p,0xff,
           "The base64 buffer has invalid size of %zu. The buffer size must be a multiple of 4 or have a remainder of division 2 and 3."
           ,base64_buffer_size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,local_38._M_dataplus._M_p,&local_59);
  sVar2 = local_50;
  paVar1 = &(__return_storage_ptr__->m_msg).field_2;
  (__return_storage_ptr__->m_msg)._M_dataplus._M_p = (pointer)paVar1;
  if (local_58 == &local_48) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_msg).field_2 + 8) = uStack_40;
  }
  else {
    (__return_storage_ptr__->m_msg)._M_dataplus._M_p = local_58;
    (__return_storage_ptr__->m_msg).field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
  }
  local_50 = 0;
  (__return_storage_ptr__->m_msg)._M_string_length = sVar2;
  local_48 = '\0';
  __return_storage_ptr__->m_code = invalid_buffer_size;
  local_58 = &local_48;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline error_code_t invalid_buffer_size_error(size_t base64_buffer_size)
    {
        constexpr size_t msg_buffer_size = 255;
        std::string msg(msg_buffer_size + 1, '\0');

        if constexpr (encoding_traits::has_pad())
        {
            constexpr std::string_view msg_template =
                "The base64 buffer has invalid size of %zu. "
                "The buffer size must be a multiple of 4.";

            std::snprintf(msg.data(), msg_buffer_size, msg_template.data(), base64_buffer_size);
        }
        else
        {
            constexpr std::string_view msg_template =
                "The base64 buffer has invalid size of %zu. "
                "The buffer size must be a multiple of 4 or have a remainder of division 2 and 3.";

            std::snprintf(msg.data(), msg_buffer_size, msg_template.data(), base64_buffer_size);
        }

        return error_code_t(error_type_t::invalid_buffer_size, msg.c_str());
    }